

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O2

void __thiscall pg::RTLSolver::run(RTLSolver *this)

{
  bitset *this_00;
  pointer ppiVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  pointer piVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  ulong uVar6;
  ulong *puVar7;
  int *piVar8;
  uint *puVar9;
  uint *puVar10;
  ostream *poVar11;
  Error *this_01;
  ulong uVar12;
  Game *pGVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  int **x;
  pointer ppiVar17;
  
  uVar12 = ((this->super_Solver).game)->n_vertices;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar12;
  uVar6 = SUB168(auVar4 * ZEXT816(0x18),0);
  uVar14 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar14 = 0xffffffffffffffff;
  }
  if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  puVar7 = (ulong *)operator_new__(uVar14);
  *puVar7 = uVar12;
  if (uVar12 != 0) {
    memset((vector<int,_std::allocator<int>_> *)(puVar7 + 1),0,
           ((uVar6 - 0x18) - (uVar6 - 0x18) % 0x18) + 0x18);
  }
  this->tin = (vector<int,_std::allocator<int>_> *)(puVar7 + 1);
  piVar8 = (int *)operator_new__(-(ulong)(uVar12 >> 0x3e != 0) | uVar12 << 2);
  this->str = piVar8;
  bitset::resize(&this->V,uVar12);
  bitset::resize(&this->W,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->R,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->Z,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->S,((this->super_Solver).game)->n_vertices);
  this_00 = &this->G;
  bitset::operator=(this_00,(this->super_Solver).disabled);
  bitset::flip(this_00);
  pGVar13 = (this->super_Solver).game;
  puVar9 = (this->Q).queue;
  uVar12 = pGVar13->n_vertices;
  (this->Q).pointer = 0;
  if (puVar9 != (uint *)0x0) {
    operator_delete__(puVar9);
    pGVar13 = (this->super_Solver).game;
  }
  puVar9 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->Q).queue = puVar9;
  uVar12 = pGVar13->n_vertices;
  (this->tangleto).pointer = 0;
  puVar9 = (this->tangleto).queue;
  if (puVar9 != (uint *)0x0) {
    operator_delete__(puVar9);
    pGVar13 = (this->super_Solver).game;
  }
  puVar9 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->tangleto).queue = puVar9;
  bitset::resize(&this->escapes,pGVar13->n_vertices);
  pGVar13 = (this->super_Solver).game;
  puVar9 = (this->pea_state).queue;
  uVar12 = pGVar13->n_vertices;
  (this->pea_state).pointer = 0;
  if (puVar9 != (uint *)0x0) {
    operator_delete__(puVar9);
    pGVar13 = (this->super_Solver).game;
  }
  puVar9 = (uint *)operator_new__((uVar12 & 0x7fffffff) << 3);
  (this->pea_state).queue = puVar9;
  uVar12 = pGVar13->n_vertices;
  (this->pea_S).pointer = 0;
  puVar9 = (this->pea_S).queue;
  if (puVar9 != (uint *)0x0) {
    operator_delete__(puVar9);
    pGVar13 = (this->super_Solver).game;
  }
  puVar9 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->pea_S).queue = puVar9;
  uVar12 = pGVar13->n_vertices * 4;
  if (0x3fffffffffffffff < (ulong)pGVar13->n_vertices) {
    uVar12 = 0xffffffffffffffff;
  }
  puVar10 = (uint *)operator_new__(uVar12);
  this->pea_vidx = puVar10;
  bitset::resize(&this->pea_root,pGVar13->n_vertices);
  if (this->onesided == false) {
    do {
      bVar5 = bitset::any(this_00);
      if (!bVar5) break;
      if ((this->super_Solver).trace != 0) {
        poVar11 = std::operator<<((this->super_Solver).logger,
                                  "\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->iterations);
        poVar11 = std::operator<<(poVar11,"\x1b[m");
        std::endl<char,std::char_traits<char>>(poVar11);
      }
      this->iterations = this->iterations + 1;
      bVar5 = rtl(this,this_00,-1,0);
    } while (bVar5);
  }
  else {
    do {
      bVar5 = bitset::any(this_00);
      if (!bVar5) break;
      if ((this->super_Solver).trace != 0) {
        poVar11 = std::operator<<((this->super_Solver).logger,
                                  "\x1b[1;38;5;196miteration\x1b[m even-\x1b[1;36m");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->iterations);
        poVar11 = std::operator<<(poVar11,"\x1b[m");
        std::endl<char,std::char_traits<char>>(poVar11);
      }
      this->iterations = this->iterations + 1;
      bVar5 = rtl(this,this_00,0,0);
    } while (bVar5);
    do {
      bVar5 = bitset::any(this_00);
      if (!bVar5) break;
      if ((this->super_Solver).trace != 0) {
        poVar11 = std::operator<<((this->super_Solver).logger,
                                  "\x1b[1;38;5;196miteration\x1b[m odd-\x1b[1;36m");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->iterations);
        poVar11 = std::operator<<(poVar11,"\x1b[m");
        std::endl<char,std::char_traits<char>>(poVar11);
      }
      this->iterations = this->iterations + 1;
      bVar5 = rtl(this,this_00,1,0);
    } while (bVar5);
  }
  poVar11 = std::operator<<((this->super_Solver).logger,"found ");
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->dominions);
  poVar11 = std::operator<<(poVar11," dominions and ");
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->tangles);
  poVar11 = std::operator<<(poVar11," tangles.");
  std::endl<char,std::char_traits<char>>(poVar11);
  poVar11 = std::operator<<((this->super_Solver).logger,"solved in ");
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->iterations);
  poVar11 = std::operator<<(poVar11," iterations.");
  std::endl<char,std::char_traits<char>>(poVar11);
  uVar14 = ((this->super_Solver).game)->n_vertices;
  uVar12 = 0;
  while ((~((long)uVar14 >> 0x3f) & uVar14) != uVar12) {
    uVar15 = uVar12 >> 6;
    uVar6 = uVar12 & 0x3f;
    uVar12 = uVar12 + 1;
    if ((((this->super_Solver).disabled)->_bits[uVar15] >> uVar6 & 1) == 0) {
      this_01 = (Error *)__cxa_allocate_exception(0x40);
      Error::Error(this_01,"search was incomplete!",
                   "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/rtl.cpp"
                   ,0x287);
      __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
    }
  }
  ppiVar1 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppiVar17 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppiVar17 != ppiVar1; ppiVar17 = ppiVar17 + 1) {
    if (*ppiVar17 != (int *)0x0) {
      operator_delete__(*ppiVar17);
    }
  }
  ppiVar1 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppiVar17 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppiVar17 != ppiVar1; ppiVar17 = ppiVar17 + 1) {
    if (*ppiVar17 != (int *)0x0) {
      operator_delete__(*ppiVar17);
    }
  }
  pvVar2 = this->tin;
  if (pvVar2 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar3 = pvVar2[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (piVar3 != (pointer)0x0) {
      lVar16 = (long)piVar3 * 0x18;
      do {
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)
                   ((long)&pvVar2[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar16));
        lVar16 = lVar16 + -0x18;
      } while (lVar16 != 0);
    }
    operator_delete__(&pvVar2[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(long)piVar3 * 0x18 + 8);
  }
  if (this->str != (int *)0x0) {
    operator_delete__(this->str);
  }
  if (this->pea_vidx == (uint *)0x0) {
    return;
  }
  operator_delete__(this->pea_vidx);
  return;
}

Assistant:

void
RTLSolver::run()
{
    tin = new std::vector<int>[nodecount()];
    str = new int[nodecount()];

    V.resize(nodecount());
    W.resize(nodecount());
    R.resize(nodecount());
    Z.resize(nodecount());
    S.resize(nodecount());
    G = disabled;
    G.flip();

    Q.resize(nodecount());

    tangleto.resize(nodecount());
    escapes.resize(nodecount());

    pea_state.resize(nodecount()*2);
    pea_S.resize(nodecount());
    pea_vidx = new unsigned int[nodecount()];
    pea_root.resize(nodecount());

    if (onesided) {
        while (G.any()) {
#ifndef NDEBUG
            if (trace) logger << "\033[1;38;5;196miteration\033[m even-\033[1;36m" << iterations << "\033[m" << std::endl;
#endif
            iterations++;

            if (!rtl(G, 0, 0)) break;
        }
        while (G.any()) {
#ifndef NDEBUG
            if (trace) logger << "\033[1;38;5;196miteration\033[m odd-\033[1;36m" << iterations << "\033[m" << std::endl;
#endif
            iterations++;

            if (!rtl(G, 1, 0)) break;
        }
    } else {
        while (G.any()) {
#ifndef NDEBUG
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations << "\033[m" << std::endl;
#endif
            iterations++;

            if (!rtl(G, -1, 0)) break;
        }
    }

    logger << "found " << dominions << " dominions and "<< tangles << " tangles." << std::endl;
    logger << "solved in " << iterations << " iterations." << std::endl;

#ifndef NDEBUG
    // Check if the whole game is now solved
    for (int i=0; i<nodecount(); i++) {
        if (!disabled[i]) { THROW_ERROR("search was incomplete!"); }
    }
#endif

    // Free all explicitly allocated memory
    for (auto &x : tv) delete[] x;
    for (auto &x : tout) delete[] x;
    delete[] tin;
    delete[] str;
    delete[] pea_vidx;
}